

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O2

void __thiscall GB::inc_r(GB *this,u8 *r)

{
  u8 uVar1;
  
  uVar1 = inc(this,*r);
  *r = uVar1;
  (this->s).op_tick = -2;
  return;
}

Assistant:

void GB::inc_r(u8& r) {
  r = inc(r);
  op_done();
}